

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

void anon_unknown.dwarf_2df0c0::debug_service_register(Caliper *c,Channel *chn)

{
  int iVar1;
  Events *pEVar2;
  ostream *poVar3;
  string local_368;
  value_type local_348;
  value_type local_328;
  value_type local_308;
  value_type local_2e8;
  value_type local_2c8;
  value_type local_2a8;
  value_type local_288;
  value_type local_268;
  value_type local_248;
  undefined1 local_220 [248];
  ios_base local_128 [264];
  int local_20;
  
  pEVar2 = cali::Channel::events(chn);
  local_248.super__Function_base._M_functor._8_8_ = 0;
  local_248.super__Function_base._M_functor._M_unused._M_object = create_attr_cb;
  local_248._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_const_cali::Attribute_&),_void_(*)(cali::Caliper_*,_const_cali::Attribute_&)>
       ::_M_invoke;
  local_248.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_const_cali::Attribute_&),_void_(*)(cali::Caliper_*,_const_cali::Attribute_&)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>_>_>
  ::push_back((vector<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>_>_>
               *)pEVar2,&local_248);
  if (local_248.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_248.super__Function_base._M_manager)
              ((_Any_data *)&local_248,(_Any_data *)&local_248,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_268.super__Function_base._M_functor._8_8_ = 0;
  local_268.super__Function_base._M_functor._M_unused._M_object = begin_cb;
  local_268._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_invoke;
  local_268.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar2->pre_begin_evt).mCb,&local_268);
  if (local_268.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_268.super__Function_base._M_manager)
              ((_Any_data *)&local_268,(_Any_data *)&local_268,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_288.super__Function_base._M_functor._8_8_ = 0;
  local_288.super__Function_base._M_functor._M_unused._M_object = end_cb;
  local_288._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_invoke;
  local_288.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar2->pre_end_evt).mCb,&local_288);
  if (local_288.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_288.super__Function_base._M_manager)
              ((_Any_data *)&local_288,(_Any_data *)&local_288,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_2a8.super__Function_base._M_functor._8_8_ = 0;
  local_2a8.super__Function_base._M_functor._M_unused._M_object = set_cb;
  local_2a8._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_invoke;
  local_2a8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&),_void_(*)(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>_>_>
  ::push_back(&(pEVar2->pre_set_evt).mCb,&local_2a8);
  if (local_2a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2a8.super__Function_base._M_manager)
              ((_Any_data *)&local_2a8,(_Any_data *)&local_2a8,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_2c8.super__Function_base._M_functor._8_8_ = 0;
  local_2c8.super__Function_base._M_functor._M_unused._M_object = finish_cb;
  local_2c8._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_2c8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->finish_evt).mCb,&local_2c8);
  if (local_2c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2c8.super__Function_base._M_manager)
              ((_Any_data *)&local_2c8,(_Any_data *)&local_2c8,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_2e8.super__Function_base._M_functor._8_8_ = 0;
  local_2e8.super__Function_base._M_functor._M_unused._M_object = create_thread_cb;
  local_2e8._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_2e8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->create_thread_evt).mCb,&local_2e8);
  if (local_2e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2e8.super__Function_base._M_manager)
              ((_Any_data *)&local_2e8,(_Any_data *)&local_2e8,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_308.super__Function_base._M_functor._8_8_ = 0;
  local_308.super__Function_base._M_functor._M_unused._M_object = release_thread_cb;
  local_308._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_invoke;
  local_308.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_void_(*)(cali::Caliper_*,_cali::Channel_*)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar2->release_thread_evt).mCb,&local_308);
  if (local_308.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_308.super__Function_base._M_manager)
              ((_Any_data *)&local_308,(_Any_data *)&local_308,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_328.super__Function_base._M_functor._8_8_ = 0;
  local_328.super__Function_base._M_functor._M_unused._M_object = snapshot_cb;
  local_328._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>
       ::_M_invoke;
  local_328.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>_>_>
  ::push_back(&(pEVar2->snapshot).mCb,&local_328);
  if (local_328.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.super__Function_base._M_manager)
              ((_Any_data *)&local_328,(_Any_data *)&local_328,__destroy_functor);
  }
  pEVar2 = cali::Channel::events(chn);
  local_348.super__Function_base._M_functor._8_8_ = 0;
  local_348.super__Function_base._M_functor._M_unused._M_object = process_snapshot_cb;
  local_348._M_invoker =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>
       ::_M_invoke;
  local_348.super__Function_base._M_manager =
       std::
       _Function_handler<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView),_void_(*)(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>
       ::_M_manager;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
  ::push_back(&(pEVar2->process_snapshot).mCb,&local_348);
  if (local_348.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_348.super__Function_base._M_manager)
              ((_Any_data *)&local_348,(_Any_data *)&local_348,__destroy_functor);
  }
  poVar3 = (ostream *)local_220;
  std::ofstream::ofstream(poVar3);
  local_20 = 1;
  iVar1 = cali::Log::verbosity();
  if (local_20 <= iVar1) {
    poVar3 = cali::Log::get_stream((Log *)local_220);
  }
  cali::Channel::name_abi_cxx11_(&local_368,chn);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": Registered debug service",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_220._0_8_ = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)(local_220 + 8));
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void debug_service_register(Caliper* c, Channel* chn)
{
    chn->events().create_attr_evt.connect(&create_attr_cb);
    chn->events().pre_begin_evt.connect(&begin_cb);
    chn->events().pre_end_evt.connect(&end_cb);
    chn->events().pre_set_evt.connect(&set_cb);
    chn->events().finish_evt.connect(&finish_cb);
    chn->events().create_thread_evt.connect(&create_thread_cb);
    chn->events().release_thread_evt.connect(&release_thread_cb);
    chn->events().snapshot.connect(&snapshot_cb);
    chn->events().process_snapshot.connect(&process_snapshot_cb);

    Log(1).stream() << chn->name() << ": Registered debug service" << std::endl;
}